

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_algorithm_suite.cpp
# Opt level: O3

void copy_suite::rotate_copy(void)

{
  basic_iterator<int> __first;
  basic_iterator<int> __last;
  basic_iterator<int> first_end;
  iterator_type *piVar1;
  back_insert_iterator<vista::circular_view<int,_18446744073709551615UL>_> __result;
  ulong uVar2;
  ulong uVar3;
  int *piVar4;
  initializer_list<int> input;
  initializer_list<int> __l;
  basic_iterator<int> __first_00;
  basic_iterator<int> __last_00;
  basic_iterator<int> first_begin;
  vector<int,_std::allocator<int>_> expect;
  circular_view<int,_18446744073709551615UL> span;
  circular_view<int,_18446744073709551615UL> copy;
  int copy_array [4];
  int array [4];
  allocator_type local_c1;
  vector<int,_std::allocator<int>_> local_c0;
  circular_view<int,_18446744073709551615UL> *local_a8;
  size_type sStack_a0;
  circular_view<int,_18446744073709551615UL> local_98;
  int local_78 [4];
  undefined1 *local_68;
  long lStack_60;
  long local_58;
  ulong local_50;
  undefined1 local_48 [16];
  type local_38 [4];
  
  local_98.member.data = local_38;
  local_38[0] = 0;
  local_38[1] = 0;
  local_38[2] = 0;
  local_38[3] = 0;
  local_98.member.cap = 4;
  local_98.member.size = 0;
  local_98.member.next = 4;
  local_68 = (undefined1 *)0x160000000b;
  lStack_60 = 0x2c00000021;
  local_58 = CONCAT44(local_58._4_4_,0x37);
  input._M_len = 5;
  input._M_array = (iterator)&local_68;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_98,input);
  local_68 = local_48;
  lStack_60 = 4;
  local_58 = 0;
  local_50 = 4;
  uVar2 = local_98.member.cap * 2;
  if ((uVar2 & local_98.member.cap * 2 - 1) == 0) {
    piVar4 = (int *)(uVar2 - 1 & local_98.member.next - local_98.member.size);
  }
  else {
    piVar4 = (int *)((local_98.member.next - local_98.member.size) % uVar2);
  }
  local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_98;
  local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       piVar4;
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++
                     ((basic_iterator<int> *)&local_c0);
  __last.parent = piVar1->parent;
  __last.current = piVar1->current;
  __first.parent = piVar1->parent;
  __first.current = piVar1->current;
  uVar2 = local_98.member.cap * 2;
  if ((uVar2 & local_98.member.cap * 2 - 1) == 0) {
    uVar2 = uVar2 - 1 & local_98.member.next;
  }
  else {
    uVar2 = local_98.member.next % uVar2;
  }
  __last_00.current = uVar2;
  __last_00.parent = &local_98;
  __result = std::__copy_move<false,false,std::random_access_iterator_tag>::
             __copy_m<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,std::back_insert_iterator<vista::circular_view<int,18446744073709551615ul>>>
                       (__first,__last_00,(circular_view<int,_18446744073709551615UL> *)&local_68);
  __first_00.current = (size_type)piVar4;
  __first_00.parent = &local_98;
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,std::back_insert_iterator<vista::circular_view<int,18446744073709551615ul>>>
            (__first_00,__last,__result);
  local_78[0] = 0x21;
  local_78[1] = 0x2c;
  local_78[2] = 0x37;
  local_78[3] = 0x16;
  __l._M_len = 4;
  __l._M_array = local_78;
  std::vector<int,_std::allocator<int>_>::vector(&local_c0,__l,&local_c1);
  uVar2 = lStack_60 * 2;
  if ((uVar2 & lStack_60 * 2 - 1U) == 0) {
    uVar3 = local_50 - local_58 & uVar2 - 1;
    sStack_a0 = uVar2 - 1 & local_50;
  }
  else {
    uVar3 = (local_50 - local_58) % uVar2;
    sStack_a0 = local_50 % uVar2;
  }
  first_end.current = sStack_a0;
  first_end.parent = (circular_view<int,_18446744073709551615UL> *)&local_68;
  first_begin.current = uVar3;
  first_begin.parent = (circular_view<int,_18446744073709551615UL> *)&local_68;
  local_a8 = (circular_view<int,_18446744073709551615UL> *)&local_68;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0xba,"void copy_suite::rotate_copy()",first_begin,first_end,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if ((view_pointer)
      local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (view_pointer)0x0) {
    operator_delete(local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void rotate_copy()
{
    int array[4] = {};
    circular_view<int> span(array);
    span = { 11, 22, 33, 44, 55 };
    int copy_array[4];
    circular_view<int> copy(copy_array);
    std::rotate_copy(span.begin(), ++span.begin(), span.end(), std::back_inserter(copy));
    {
        std::vector<int> expect = { 33, 44, 55, 22 };
        BOOST_TEST_ALL_EQ(copy.begin(), copy.end(),
                          expect.begin(), expect.end());
    }
}